

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

void vkt::image::anon_unknown_0::commandCopyImageToBuffer
               (Context *context,VkCommandBuffer cmdBuffer,VkImage image,VkBuffer buffer,
               VkDeviceSize bufferSizeBytes,Texture *texture)

{
  VkImageSubresourceRange subresourceRange;
  DeviceInterface *pDVar1;
  deUint32 arraySize;
  VkExtent3D extent;
  VkBufferMemoryBarrier copyBarrier;
  VkBufferImageCopy copyRegion;
  VkImageMemoryBarrier prepareForTransferBarrier;
  
  pDVar1 = Context::getDeviceInterface(context);
  arraySize = 6;
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = texture->m_numLayers;
  makeImageMemoryBarrier
            (&prepareForTransferBarrier,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,image,subresourceRange);
  extent.height = 0;
  extent.width = (texture->m_layerSize).m_data[2];
  extent.depth = texture->m_numLayers;
  makeBufferImageCopy(&copyRegion,*(image **)(texture->m_layerSize).m_data,extent,arraySize);
  makeBufferMemoryBarrier(&copyBarrier,0x1000,0x2000,buffer,0,bufferSizeBytes);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,cmdBuffer,0x800,0x1000,0,0,0,0,0,1,(int)&prepareForTransferBarrier);
  (*pDVar1->_vptr_DeviceInterface[99])
            (pDVar1,cmdBuffer,image.m_internal,6,buffer.m_internal,1,(int)&copyRegion);
  (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,cmdBuffer,0x1000,0x4000,0,0,0,1,&copyBarrier,0,0);
  return;
}

Assistant:

void commandCopyImageToBuffer (Context&					context,
							   const VkCommandBuffer	cmdBuffer,
							   const VkImage			image,
							   const VkBuffer			buffer,
							   const VkDeviceSize		bufferSizeBytes,
							   const Texture&			texture)
{
	const DeviceInterface& vk = context.getDeviceInterface();

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, texture.numLayers());
	const VkImageMemoryBarrier prepareForTransferBarrier = makeImageMemoryBarrier(
		VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
		VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		image, fullImageSubresourceRange);

	const VkBufferImageCopy copyRegion = makeBufferImageCopy(texture);

	const VkBufferMemoryBarrier copyBarrier = makeBufferMemoryBarrier(
		VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT,
		buffer, 0ull, bufferSizeBytes);

	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &prepareForTransferBarrier);
	vk.cmdCopyImageToBuffer(cmdBuffer, image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, buffer, 1u, &copyRegion);
	vk.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
}